

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagCode.cpp
# Opt level: O0

string_view slang::getDefaultMessage(DiagCode code)

{
  DiagCode *pDVar1;
  bool bVar2;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_DiagnosticSeverity,_basic_string_view<char,_char_traits<char>_>_>_>
  *p_Var3;
  string_view sVar4;
  const_iterator it;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  *in_stack_fffffffffffffe98;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  *in_stack_fffffffffffffea0;
  DiagCode *in_stack_fffffffffffffea8;
  undefined1 *puVar5;
  equal_to<slang::DiagCode> *this;
  DiagCode local_114;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_DiagnosticSeverity,_basic_string_view<char,_char_traits<char>_>_>_>
  local_110;
  DiagCode *local_100;
  undefined1 *local_f8;
  char_pointer local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  DiagCode *local_d0;
  undefined1 *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_b0;
  DiagCode *local_98;
  undefined1 *local_90;
  iterator local_88;
  size_t local_78;
  DiagCode *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  DiagCode *local_10;
  equal_to<slang::DiagCode> *local_8;
  
  local_f8 = data;
  local_100 = &local_114;
  local_c8 = data;
  local_90 = data;
  local_68 = data;
  puVar5 = data;
  local_d0 = local_100;
  local_98 = local_100;
  local_70 = local_100;
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             ::hash_for<slang::DiagCode>
                       (in_stack_fffffffffffffea0,(DiagCode *)in_stack_fffffffffffffe98);
  pDVar1 = local_70;
  local_18 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             ::position_for(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  local_10 = pDVar1;
  local_20 = local_78;
  this = (equal_to<slang::DiagCode> *)puVar5;
  local_8 = (equal_to<slang::DiagCode> *)puVar5;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
               ::groups((table_arrays<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                         *)0x7e86e2);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                 ::elements((table_arrays<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                             *)0x7e872d);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffea0 =
             (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
              *)boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                        *)0x7e877d);
        in_stack_fffffffffffffea8 = local_10;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::DiagnosticSeverity,std::basic_string_view<char,std::char_traits<char>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::DiagnosticSeverity,std::basic_string_view<char,std::char_traits<char>>>>>>
        ::
        key_from<std::pair<slang::DiagCode_const,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::DiagnosticSeverity,std::basic_string_view<char,std::char_traits<char>>>>>
                  ((pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)0x7e87aa);
        bVar2 = std::equal_to<slang::DiagCode>::operator()
                          (this,in_stack_fffffffffffffea8,(DiagCode *)in_stack_fffffffffffffea0);
        if (bVar2) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
          goto LAB_007e889e;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
    if (bVar2) break;
    bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,*(size_t *)((equal_to<slang::DiagCode> *)puVar5 + 8));
    if (!bVar2) {
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::table_locator(&local_b0);
LAB_007e889e:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                 ::make_iterator((locator *)0x7e88ab);
      local_e0.pc_ = local_88.pc_;
      local_e0.p_ = local_88.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
      local_f0 = local_c0.pc_;
      local_e8 = local_c0.p_;
      boost::unordered::
      unordered_flat_map<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
      ::end((unordered_flat_map<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             *)0x7e8930);
      bVar2 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      if (bVar2) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffea0);
        p_Var3 = std::
                 get<1ul,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::DiagnosticSeverity,std::basic_string_view<char,std::char_traits<char>>>
                           ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>
                             *)0x7e8965);
        local_110 = *p_Var3;
      }
      else {
        local_110 = sv((char *)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
      }
      sVar4._M_len = local_110._M_len;
      sVar4._M_str = local_110._M_str;
      return sVar4;
    }
  }
  memset(&local_b0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagnosticSeverity,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::table_locator(&local_b0);
  goto LAB_007e889e;
}

Assistant:

std::string_view getDefaultMessage(DiagCode code) {
    if (auto it = data.find(code); it != data.end())
        return std::get<1>(it->second);
    return ""sv;
}